

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_reader.cc
# Opt level: O0

bool __thiscall xsettingsd::DataReader::ReadInt32(DataReader *this,int32_t *out)

{
  bool bVar1;
  uint32_t uVar2;
  int32_t *out_local;
  DataReader *this_local;
  
  if ((this->buf_len_ < this->bytes_read_ + 4) || (this->bytes_read_ + 4 < this->bytes_read_)) {
    this_local._7_1_ = false;
  }
  else {
    if ((out != (int32_t *)0x0) &&
       (*out = *(int32_t *)(this->buffer_ + this->bytes_read_), (this->reverse_bytes_ & 1U) != 0)) {
      bVar1 = IsLittleEndian();
      if (bVar1) {
        uVar2 = ntohl(*out);
        *out = uVar2;
      }
      else {
        uVar2 = htonl(*out);
        *out = uVar2;
      }
    }
    this->bytes_read_ = this->bytes_read_ + 4;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DataReader::ReadInt32(int32_t* out) {
  if (bytes_read_ + sizeof(int32_t) > buf_len_ ||
      bytes_read_ + sizeof(int32_t) < bytes_read_) {
    return false;
  }

  if (out) {
    *out = *reinterpret_cast<const int32_t*>(buffer_ + bytes_read_);
    if (reverse_bytes_) {
      if (IsLittleEndian())
        *out = ntohl(*out);
      else
        *out = htonl(*out);
    }
  }
  bytes_read_ += sizeof(int32_t);
  return true;
}